

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtCompareRev(word *pIn1,word *pIn2,int nWords)

{
  int local_28;
  int w;
  int nWords_local;
  word *pIn2_local;
  word *pIn1_local;
  
  local_28 = nWords + -1;
  while( true ) {
    if (local_28 < 0) {
      return 0;
    }
    if (pIn1[local_28] != pIn2[local_28]) break;
    local_28 = local_28 + -1;
  }
  if (pIn2[local_28] <= pIn1[local_28]) {
    return 1;
  }
  return -1;
}

Assistant:

static inline int Abc_TtCompareRev( word * pIn1, word * pIn2, int nWords )
{
    int w;
    for ( w = nWords - 1; w >= 0; w-- )
        if ( pIn1[w] != pIn2[w] )
            return (pIn1[w] < pIn2[w]) ? -1 : 1;
    return 0;
}